

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O2

void __thiscall wasm::FuncCastEmulation::run(FuncCastEmulation *this,Module *module)

{
  ElementSegment *pEVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  unsigned_long uVar6;
  Function *pFVar7;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  pointer puVar8;
  uint uVar9;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Name,_wasm::Function_*>,_false,_true>,_bool>
  pVar10;
  Signature sig;
  undefined1 local_1f8 [320];
  undefined1 local_b8 [8];
  unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  funcThunks;
  HeapType ABIType;
  Type local_60;
  pointer local_58;
  unsigned_long local_50;
  Pass *local_48;
  Module *local_40;
  allocator<char> local_32;
  allocator<char> local_31;
  
  local_48 = &this->super_Pass;
  local_40 = module;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,"max-func-params",&local_31)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcThunks._M_h._M_single_bucket,"16",&local_32);
  Pass::getArgumentOrDefault
            ((string *)local_1f8,local_48,(string *)local_b8,
             (string *)&funcThunks._M_h._M_single_bucket);
  uVar6 = std::__cxx11::stoul((string *)local_1f8,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)&funcThunks._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)local_b8);
  local_b8 = (undefined1  [8])0x3;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_1f8,uVar6 & 0xffffffff,
             (value_type *)local_b8,(allocator_type *)&local_31);
  local_50 = uVar6;
  wasm::Type::Type(&local_60,(Tuple *)local_1f8);
  sig.results.id = 3;
  sig.params.id = local_60.id;
  HeapType::HeapType((HeapType *)&funcThunks._M_h._M_single_bucket,sig);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)local_1f8);
  local_b8 = (undefined1  [8])&funcThunks._M_h._M_rehash_policy._M_next_resize;
  funcThunks._M_h._M_buckets = (__buckets_ptr)0x1;
  funcThunks._M_h._M_bucket_count = 0;
  funcThunks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  funcThunks._M_h._M_element_count._0_4_ = 0x3f800000;
  funcThunks._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  funcThunks._M_h._M_rehash_policy._4_4_ = 0;
  funcThunks._M_h._M_rehash_policy._M_next_resize = 0;
  local_58 = (local_40->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (local_40->elementSegments).
                super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != local_58; puVar8 = puVar8 + 1)
  {
    bVar5 = wasm::Type::isFunction
                      (&((puVar8->_M_t).
                         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                         .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->type);
    if (bVar5) {
      uVar9 = 0;
      while( true ) {
        pEVar1 = (puVar8->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        lVar2 = *(long *)&(pEVar1->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl;
        if ((ulong)((long)*(pointer *)
                           ((long)&(pEVar1->data).
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           + 8) - lVar2 >> 3) <= (ulong)uVar9) break;
        pcVar3 = *(char **)(lVar2 + (ulong)uVar9 * 8);
        if (*pcVar3 == '+') {
          local_1f8._0_4_ = *(undefined4 *)(pcVar3 + 0x10);
          local_1f8._4_4_ = *(undefined4 *)(pcVar3 + 0x14);
          local_1f8._8_4_ = *(undefined4 *)(pcVar3 + 0x18);
          local_1f8._12_4_ = *(undefined4 *)(pcVar3 + 0x1c);
          local_1f8._16_8_ = 0;
          pVar10 = std::
                   _Hashtable<wasm::Name,std::pair<wasm::Name_const,wasm::Function*>,std::allocator<std::pair<wasm::Name_const,wasm::Function*>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                   ::_M_emplace<std::pair<wasm::Name_const,wasm::Function*>>
                             ((_Hashtable<wasm::Name,std::pair<wasm::Name_const,wasm::Function*>,std::allocator<std::pair<wasm::Name_const,wasm::Function*>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                               *)local_b8,
                              (_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)local_1f8);
          if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            pFVar7 = *(Function **)
                      ((long)pVar10.first.
                             super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Function_*>,_true>
                             ._M_cur.
                             super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Function_*>,_true>
                      + 0x18);
          }
          else {
            pFVar7 = makeThunk((FuncCastEmulation *)local_48,(Name)((IString *)(pcVar3 + 0x10))->str
                               ,local_40,(Index)local_50);
            *(Function **)
             ((long)pVar10.first.
                    super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Function_*>,_true>.
                    _M_cur.
                    super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Function_*>,_true> +
             0x18) = pFVar7;
          }
          pcVar4 = (pFVar7->super_Importable).super_Named.name.super_IString.str._M_str;
          *(size_t *)(pcVar3 + 0x10) =
               (pFVar7->super_Importable).super_Named.name.super_IString.str._M_len;
          *(char **)(pcVar3 + 0x18) = pcVar4;
          wasm::Type::Type((Type *)local_1f8,(HeapType)(pFVar7->type).id,NonNullable,Inexact);
          *(ulong *)(pcVar3 + 8) = CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
        }
        uVar9 = uVar9 + 1;
      }
    }
  }
  ParallelFuncCastEmulation::ParallelFuncCastEmulation
            ((ParallelFuncCastEmulation *)local_1f8,(HeapType)funcThunks._M_h._M_single_bucket,
             (Index)local_50);
  WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
  ::run((WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
         *)local_1f8,local_48->runner,local_40);
  WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
  ::~WalkerPass((WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                 *)local_1f8);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_b8);
  return;
}

Assistant:

void run(Module* module) override {
    Index numParams = std::stoul(getArgumentOrDefault("max-func-params", "16"));
    // we just need the one ABI function type for all indirect calls
    HeapType ABIType(
      Signature(Type(std::vector<Type>(numParams, Type::i64)), Type::i64));
    // Add a thunk for each function in the table, and do the call through it.
    std::unordered_map<Name, Function*> funcThunks;
    for (auto& segment : module->elementSegments) {
      if (!segment->type.isFunction()) {
        continue;
      }
      for (Index i = 0; i < segment->data.size(); ++i) {
        auto* ref = segment->data[i]->dynCast<RefFunc>();
        if (!ref) {
          continue;
        }
        auto [iter, inserted] = funcThunks.insert({ref->func, nullptr});
        if (inserted) {
          iter->second = makeThunk(ref->func, module, numParams);
        }
        auto* thunk = iter->second;
        ref->func = thunk->name;
        // TODO: Make this exact.
        ref->type = Type(thunk->type, NonNullable);
      }
    }

    // update call_indirects
    ParallelFuncCastEmulation(ABIType, numParams).run(getPassRunner(), module);
  }